

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<ear::ngonVertexOrder(Eigen::Matrix<double,_1,_1,0,_1,_1>)::__0,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,
               CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *src,assign_op<double,_double> *func)

{
  ActualDstType actualDst;
  assign_op<double,_double> *func_local;
  CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *src_local;
  Matrix<double,__1,_1,_0,__1,_1> *dst_local;
  
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/src/common/geom.cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}